

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddhcal.cpp
# Opt level: O2

int32_t __thiscall icu_63::BuddhistCalendar::handleGetExtendedYear(BuddhistCalendar *this)

{
  UCalendarDateFields UVar1;
  int32_t iVar2;
  
  UVar1 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_YEAR);
  if (UVar1 == UCAL_EXTENDED_YEAR) {
    if ((this->super_GregorianCalendar).super_Calendar.fStamp[0x13] < 1) {
      iVar2 = 0x7b2;
    }
    else {
      iVar2 = (this->super_GregorianCalendar).super_Calendar.fFields[0x13];
    }
  }
  else {
    iVar2 = 0x7b2;
    if (0 < (this->super_GregorianCalendar).super_Calendar.fStamp[1]) {
      iVar2 = (this->super_GregorianCalendar).super_Calendar.fFields[1] + -0x21f;
    }
  }
  return iVar2;
}

Assistant:

int32_t BuddhistCalendar::handleGetExtendedYear()
{
    // EXTENDED_YEAR in BuddhistCalendar is a Gregorian year.
    // The default value of EXTENDED_YEAR is 1970 (Buddhist 2513)
    int32_t year;
    if (newerField(UCAL_EXTENDED_YEAR, UCAL_YEAR) == UCAL_EXTENDED_YEAR) {
        year = internalGet(UCAL_EXTENDED_YEAR, kGregorianEpoch);
    } else {
        // extended year is a gregorian year, where 1 = 1AD,  0 = 1BC, -1 = 2BC, etc 
        year = internalGet(UCAL_YEAR, kGregorianEpoch - kBuddhistEraStart)
                + kBuddhistEraStart;
    }
    return year;
}